

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O2

CURLcode rtsp_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  Curl_RtspReq CVar1;
  FILEPROTO *pFVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  
  pFVar2 = (data->req).p.file;
  CVar4 = Curl_http_done(data,status,(data->set).rtspreq == RTSPREQ_RECEIVE || premature);
  if (((status == CURLE_OK) && (pFVar2 != (FILEPROTO *)0x0)) && (CVar4 == CURLE_OK)) {
    CVar1 = (data->set).rtspreq;
    if (pFVar2->path == pFVar2->freepath || CVar1 == RTSPREQ_RECEIVE) {
      CVar4 = CURLE_OK;
      if (CVar1 == RTSPREQ_RECEIVE) {
        if (((((data->conn->proto).rtspc.rtp_channel == -1) &&
             (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ))) && (Curl_infof(data,"Got an RTP Receive with a CSeq of %ld",pFVar2->freepath),
                    (data->set).rtspreq != RTSPREQ_RECEIVE)) {
          return CURLE_OK;
        }
        CVar4 = CURLE_OK;
        if (((data->req).field_0xd1 & 0x10) != 0) {
          Curl_failf(data,"Server prematurely closed the RTSP connection.");
          CVar4 = CURLE_RECV_ERROR;
        }
      }
    }
    else {
      Curl_failf(data,"The CSeq of this request %ld did not match the response %ld");
      CVar4 = CURLE_RTSP_CSEQ_ERROR;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode rtsp_done(struct Curl_easy *data,
                          CURLcode status, bool premature)
{
  struct RTSP *rtsp = data->req.p.rtsp;
  CURLcode httpStatus;

  /* Bypass HTTP empty-reply checks on receive */
  if(data->set.rtspreq == RTSPREQ_RECEIVE)
    premature = TRUE;

  httpStatus = Curl_http_done(data, status, premature);

  if(rtsp && !status && !httpStatus) {
    /* Check the sequence numbers */
    long CSeq_sent = rtsp->CSeq_sent;
    long CSeq_recv = rtsp->CSeq_recv;
    if((data->set.rtspreq != RTSPREQ_RECEIVE) && (CSeq_sent != CSeq_recv)) {
      failf(data,
            "The CSeq of this request %ld did not match the response %ld",
            CSeq_sent, CSeq_recv);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    if(data->set.rtspreq == RTSPREQ_RECEIVE &&
       (data->conn->proto.rtspc.rtp_channel == -1)) {
      infof(data, "Got an RTP Receive with a CSeq of %ld", CSeq_recv);
    }
    if(data->set.rtspreq == RTSPREQ_RECEIVE &&
       data->req.eos_written) {
      failf(data, "Server prematurely closed the RTSP connection.");
      return CURLE_RECV_ERROR;
    }
  }

  return httpStatus;
}